

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::
emplace_back<slang::IntervalMapDetails::NodeRef_const&>
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,NodeRef *args)

{
  pointer __src;
  pointer pNVar1;
  size_type sVar2;
  ulong uVar3;
  pointer pNVar4;
  pointer pNVar5;
  pointer pNVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  pNVar1 = this->data_;
  __src = pNVar1 + this->len;
  if (this->len != this->cap) {
    (__src->pip).value = (args->pip).value;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return pNVar1 + sVar2;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar3 = this->cap;
  if (uVar8 < uVar3 * 2) {
    uVar8 = uVar3 * 2;
  }
  if (0xfffffffffffffff - uVar3 < uVar3) {
    uVar8 = 0xfffffffffffffff;
  }
  lVar9 = (long)__src - (long)this->data_;
  pNVar6 = (pointer)operator_new(uVar8 * 8);
  *(uintptr_t *)((long)pNVar6 + lVar9) = (args->pip).value;
  pNVar1 = this->data_;
  sVar2 = this->len;
  lVar7 = (long)pNVar1 + (sVar2 * 8 - (long)__src);
  pNVar4 = pNVar1;
  pNVar5 = pNVar6;
  if (lVar7 == 0) {
    if (sVar2 != 0) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&(pNVar6->pip).value + lVar7) =
             *(undefined8 *)((long)&(pNVar1->pip).value + lVar7);
        lVar7 = lVar7 + 8;
      } while (sVar2 << 3 != lVar7);
    }
  }
  else {
    for (; pNVar4 != __src; pNVar4 = pNVar4 + 1) {
      (pNVar5->pip).value = (pNVar4->pip).value;
      pNVar5 = pNVar5 + 1;
    }
    memcpy((void *)((long)pNVar6 + lVar9 + 8),__src,(lVar7 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (pNVar1 != (pointer)this->firstElement) {
    operator_delete(pNVar1);
  }
  this->len = this->len + 1;
  this->cap = uVar8;
  this->data_ = pNVar6;
  return (reference)((long)pNVar6 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }